

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleQuadrature.hpp
# Opt level: O2

RectMatrix<double,_3U,_3U> *
OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,_3U,_3U>,_double>::Integrate
          (RectMatrix<double,_3U,_3U> *__return_storage_ptr__,
          function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *f,
          TriangleQuadratureRule *rule,double *area)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  long lVar4;
  long lVar5;
  RectMatrix<double,_3U,_3U> integral;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  long *plVar3;
  
  iVar1 = (*rule->_vptr_TriangleQuadratureRule[3])(rule);
  iVar2 = (*rule->_vptr_TriangleQuadratureRule[4])(rule);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  std::function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>::operator()
            (&local_78,f,*(Vector<double,_2U> **)CONCAT44(extraout_var,iVar1));
  operator*(&integral,&local_78,*(double *)*plVar3);
  lVar5 = 0x10;
  for (lVar4 = 1; lVar4 < (int)((ulong)(plVar3[1] - *plVar3) >> 3); lVar4 = lVar4 + 1) {
    std::function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)>::
    operator()(&local_c0,f,(Vector<double,_2U> *)(*(long *)CONCAT44(extraout_var,iVar1) + lVar5));
    operator*(&local_78,&local_c0,*(double *)(*plVar3 + lVar4 * 8));
    RectMatrix<double,_3U,_3U>::add(&integral,&local_78);
    lVar5 = lVar5 + 0x10;
  }
  operator*(__return_storage_ptr__,&integral,*area);
  return __return_storage_ptr__;
}

Assistant:

NumericReturnType TriangleQuadrature<NumericReturnType, T>::Integrate(
      const std::function<NumericReturnType(const Vector<T, 2>&)>& f,
      const TriangleQuadratureRule& rule, const T& area) {
    // Get the quadrature points and weights.
    const std::vector<Vector2<T>>& barycentric_coordinates =
        rule.quadrature_points();
    const std::vector<T>& weights = rule.weights();
    assert(barycentric_coordinates.size() == weights.size());
    assert(weights.size() >= 1);

    // Sum the weighted function evaluated at the transformed
    // quadrature points.  The looping is done in this particular way
    // so that the return type can be either a traditional scalar
    // (e.g., `double`), a Vector, or some other numeric type,
    // without having to worry about the numerous possible ways to
    // initialize to zero (e.g., `double integral = 0.0` vs.
    // VectorXd = VectorXd:zZero())` or having to know
    // the dimension of the NumericReturnType (i.e., scalar or vector
    // dimension).
    NumericReturnType integral = f(barycentric_coordinates[0]) * weights[0];
    for (int i = 1; i < static_cast<int>(weights.size()); ++i)
      integral += f(barycentric_coordinates[i]) * weights[i];

    return integral * area;
  }